

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level.cxx
# Opt level: O1

xr_image * load<xray_re::xr_image>(char *path,char *name,bool required)

{
  bool bVar1;
  int iVar2;
  xr_image *this;
  undefined7 in_register_00000011;
  
  if (xray_re::xr_file_system::instance()::instance0 == '\0') {
    iVar2 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0,name,
                                CONCAT71(in_register_00000011,required));
    if (iVar2 != 0) {
      xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
      __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                   &xray_re::xr_file_system::instance::instance0,&__dso_handle);
      __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
    }
  }
  bVar1 = xray_re::xr_file_system::file_exist
                    (&xray_re::xr_file_system::instance::instance0,path,name);
  if (bVar1) {
    xray_re::msg("loading %s",name);
    this = (xr_image *)operator_new(0x18);
    this->_vptr_xr_image = (_func_int **)&PTR__xr_image_00248860;
    this->m_width = 0;
    this->m_height = 0;
    this->m_data = (rgba32 *)0x0;
    bVar1 = xray_re::xr_image::load_dds(this,path,name);
    if (!bVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level.cxx"
                    ,0x90,"xr_image *load(const char *, const char *, bool)");
    }
  }
  else {
    this = (xr_image *)0x0;
  }
  return this;
}

Assistant:

xr_image* load(const char* path, const char* name, bool required)
{
	xr_file_system& fs = xr_file_system::instance();
	if (fs.file_exist(path, name)) {
		msg("loading %s", name);
		xr_image* image = new xr_image;
		if (!image->load_dds(path, name))
			xr_not_expected();
		return image;
	}
	return 0;
}